

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O3

double sisl::tp_linear::phi<3>(vector *p)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  if (2 < (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    lVar1 = 0;
    dVar2 = 1.0;
    do {
      dVar3 = ABS((p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data[lVar1]);
      dVar2 = dVar2 * (double)(-(ulong)(dVar3 <= 1.0) & (ulong)(1.0 - dVar3));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    return dVar2;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

static const double phi(const vector &p) {
            double prod = 1;
            for(unsigned int i = 0; i < N; i++) prod *= bspline_1(p[i]);
            return prod;
        }